

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
A::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>>
          (A *this,AVisitor<hiberlite::KillChildren> *ar)

{
  allocator local_342;
  allocator local_341;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1c0;
  sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_> local_178;
  sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_130;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8
  ;
  sql_nvp<int> local_a0;
  sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_> local_58;
  
  std::__cxx11::string::string((string *)&local_1e0,"seti",&local_341);
  std::__cxx11::string::string((string *)&local_200,"",&local_342);
  hiberlite::sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_>::sql_nvp
            (&local_58,&local_1e0,&this->seti,&local_200);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_58);
  hiberlite::sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_>::~sql_nvp
            (&local_58);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string((string *)&local_220,"i",&local_341);
  std::__cxx11::string::string((string *)&local_240,"",&local_342);
  hiberlite::sql_nvp<int>::sql_nvp(&local_a0,&local_220,&this->i,&local_240);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_a0);
  hiberlite::sql_nvp<int>::~sql_nvp(&local_a0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_260,"s",&local_341);
  std::__cxx11::string::string((string *)&local_280,"",&local_342);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_e8,&local_260,&this->s,&local_280);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_e8);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_e8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string((string *)&local_2a0,"vi",&local_341);
  std::__cxx11::string::string((string *)&local_2c0,"",&local_342);
  hiberlite::sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  sql_nvp(&local_130,&local_2a0,&this->vi,&local_2c0);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_130);
  hiberlite::sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~sql_nvp(&local_130);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2e0,"v",&local_341);
  std::__cxx11::string::string((string *)&local_300,"",&local_342);
  hiberlite::sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  ::sql_nvp(&local_178,&local_2e0,&this->v,&local_300);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_178);
  hiberlite::sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  ::~sql_nvp(&local_178);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::string((string *)&local_320,"mm",&local_341);
  std::__cxx11::string::string((string *)&local_340,"",&local_342);
  hiberlite::
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::sql_nvp(&local_1c0,&local_320,&this->mm,&local_340);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_1c0);
  hiberlite::
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~sql_nvp(&local_1c0);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_320);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
		ar & HIBERLITE_NVP(seti);
		ar & HIBERLITE_NVP(i);
		ar & HIBERLITE_NVP(s);
		ar & HIBERLITE_NVP(vi);
		ar & HIBERLITE_NVP(v);
		ar & HIBERLITE_NVP(mm);
	}